

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

void __thiscall
spvtools::val::Function::RegisterExecutionModelLimitation
          (Function *this,ExecutionModel model,string *message)

{
  ExecutionModel *pEVar1;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  ExecutionModel local_48;
  string local_40 [32];
  
  local_48 = model;
  std::__cxx11::string::string(local_40,(string *)message);
  local_68._8_8_ = 0;
  pEVar1 = (ExecutionModel *)operator_new(0x28);
  *pEVar1 = local_48;
  std::__cxx11::string::string((string *)(pEVar1 + 2),local_40);
  local_50 = std::
             _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/function.cpp:376:7)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/function.cpp:376:7)>
             ::_M_manager;
  local_68._M_unused._M_object = pEVar1;
  std::__cxx11::
  list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
  ::push_back(&this->execution_model_limitations_,(value_type *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void Function::RegisterExecutionModelLimitation(spv::ExecutionModel model,
                                                const std::string& message) {
  execution_model_limitations_.push_back(
      [model, message](spv::ExecutionModel in_model, std::string* out_message) {
        if (model != in_model) {
          if (out_message) {
            *out_message = message;
          }
          return false;
        }
        return true;
      });
}